

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_GetOwnPropertyNamesInternal
              (JSContext *ctx,JSPropertyEnum **ptab,uint32_t *plen,JSObject *p,int flags)

{
  JSClassExoticMethods *pJVar1;
  JSValue obj;
  JSValue JVar2;
  JSValue obj_00;
  bool bVar3;
  JSAtomKindEnum JVar4;
  int iVar5;
  BOOL BVar6;
  uint uVar7;
  JSAtom JVar8;
  uint32_t uVar9;
  JSValueUnion in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  JSContext *in_RDI;
  uint in_R8D;
  int len;
  int res;
  JSPropertyDescriptor desc;
  JSClassExoticMethods *em;
  JSVarRef *var_ref;
  JSAtomKindEnum kind;
  uint32_t num_key;
  BOOL num_sorted;
  BOOL is_enumerable;
  uint32_t exotic_keys_count;
  uint32_t exotic_count;
  uint32_t sym_index;
  uint32_t str_index;
  uint32_t num_index;
  uint32_t atom_count;
  uint32_t sym_keys_count;
  uint32_t str_keys_count;
  uint32_t num_keys_count;
  JSAtom atom;
  JSPropertyEnum *tab_exotic;
  JSPropertyEnum *tab_atom;
  JSShapeProperty *prs;
  JSShape *sh;
  int j;
  int i;
  void *in_stack_00000410;
  cmp_f in_stack_00000418;
  size_t in_stack_00000420;
  size_t in_stack_00000428;
  void *in_stack_00000430;
  JSPropertyDescriptor *in_stack_fffffffffffffed8;
  JSContext *tab;
  JSValueUnion in_stack_fffffffffffffee0;
  JSAtom in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  JSAtom in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  JSAtom in_stack_ffffffffffffff2c;
  JSContext *in_stack_ffffffffffffff30;
  uint local_84;
  int local_80;
  uint32_t local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  uint local_60;
  JSAtom local_5c;
  JSPropertyEnum *local_58;
  void *local_50;
  JSShapeProperty *local_48;
  JSShape *local_40;
  uint local_34;
  uint local_30;
  uint local_2c;
  JSValueUnion local_28;
  int *local_20;
  undefined8 *local_18;
  JSContext *local_10;
  
  *in_RSI = 0;
  *in_RDX = 0;
  local_60 = 0;
  local_64 = 0;
  local_68 = 0;
  local_80 = 0;
  local_7c = 0;
  local_58 = (JSPropertyEnum *)0x0;
  local_40 = *(JSShape **)((long)in_RCX.ptr + 0x18);
  local_30 = 0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = get_shape_prop(local_40);
  for (; (int)local_30 < local_40->prop_count; local_30 = local_30 + 1) {
    local_5c = local_48->atom;
    if (local_5c != 0) {
      uVar7 = *(uint *)local_48;
      JVar4 = JS_AtomGetKind((JSContext *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             in_stack_fffffffffffffef4);
      if ((((local_2c & 0x10) == 0) || ((uVar7 >> 0x1a & 4) != 0)) &&
         (((int)local_2c >> ((byte)JVar4 & 0x1f) & 1U) != 0)) {
        if ((((*(uint *)local_48 >> 0x1a & 0x30) == 0x20) && ((local_2c & 0x30) != 0)) &&
           (iVar5 = JS_IsUninitialized(**(JSValue **)
                                         (*(long *)(*(long *)((long)local_28.ptr + 0x20) +
                                                   (long)(int)local_30 * 0x10) + 0x18)), iVar5 != 0)
           ) {
          JS_ThrowReferenceErrorUninitialized(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          return -1;
        }
        BVar6 = JS_AtomIsArrayIndex((JSContext *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    (uint32_t *)
                                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffeec);
        if (BVar6 == 0) {
          if (JVar4 == JS_ATOM_KIND_STRING) {
            local_64 = local_64 + 1;
          }
          else {
            local_68 = local_68 + 1;
          }
        }
        else {
          local_60 = local_60 + 1;
        }
      }
    }
    local_48 = local_48 + 1;
  }
  if ((*(byte *)((long)local_28.ptr + 5) >> 2 & 1) != 0) {
    if ((*(byte *)((long)local_28.ptr + 5) >> 3 & 1) == 0) {
      if (*(short *)((long)local_28.ptr + 6) == 5) {
        if ((local_2c & 1) != 0) {
          obj_00.tag = -1;
          obj_00.u.ptr = local_28.ptr;
          uVar9 = js_string_obj_get_length(local_10,obj_00);
          local_60 = uVar9 + local_60;
        }
      }
      else {
        pJVar1 = local_10->rt->class_array[*(ushort *)((long)local_28.ptr + 6)].exotic;
        if ((pJVar1 != (JSClassExoticMethods *)0x0) &&
           (pJVar1->get_own_property_names !=
            (_func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *)0x0)) {
          JVar2.tag = -1;
          JVar2.u.ptr = local_28.ptr;
          iVar5 = (*pJVar1->get_own_property_names)(local_10,&local_58,&local_7c,JVar2);
          if (iVar5 != 0) {
            return -1;
          }
          for (local_30 = 0; local_30 < local_7c; local_30 = local_30 + 1) {
            local_5c = local_58[(int)local_30].atom;
            JVar4 = JS_AtomGetKind((JSContext *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   in_stack_fffffffffffffef4);
            if (((int)local_2c >> ((byte)JVar4 & 0x1f) & 1U) != 0) {
              local_84 = 0;
              if ((local_2c & 0x30) != 0) {
                in_stack_fffffffffffffef4 =
                     JS_GetOwnPropertyInternal
                               ((JSContext *)desc.setter.u.ptr,
                                (JSPropertyDescriptor *)desc.getter.tag,
                                (JSObject *)desc.getter.u.ptr,desc.value.tag._4_4_);
                if ((int)in_stack_fffffffffffffef4 < 0) {
                  js_free_prop_enum((JSContext *)in_stack_fffffffffffffee0.ptr,
                                    (JSPropertyEnum *)in_stack_fffffffffffffed8,0);
                  return -1;
                }
                if (in_stack_fffffffffffffef4 != 0) {
                  local_84 = (uint)((in_stack_fffffffffffffef8 & 4) != 0);
                  js_free_desc((JSContext *)in_stack_fffffffffffffee0.ptr,in_stack_fffffffffffffed8)
                  ;
                }
                local_58[(int)local_30].is_enumerable = local_84;
              }
              if (((local_2c & 0x10) == 0) || (local_84 != 0)) {
                local_80 = local_80 + 1;
              }
            }
          }
        }
      }
    }
    else if ((local_2c & 1) != 0) {
      local_60 = *(int *)((long)local_28.ptr + 0x40) + local_60;
    }
  }
  local_6c = local_60 + local_64 + local_68 + local_80;
  tab = local_10;
  max_int(local_6c,1);
  local_50 = js_malloc((JSContext *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (local_50 == (void *)0x0) {
    js_free_prop_enum((JSContext *)in_stack_fffffffffffffee0.ptr,(JSPropertyEnum *)tab,0);
    return -1;
  }
  local_70 = 0;
  local_74 = local_60;
  local_78 = local_60 + local_64;
  bVar3 = true;
  local_40 = *(JSShape **)((long)local_28.ptr + 0x18);
  local_30 = 0;
  local_48 = get_shape_prop(local_40);
  for (; (int)local_30 < local_40->prop_count; local_30 = local_30 + 1) {
    local_5c = local_48->atom;
    if (local_5c != 0) {
      uVar7 = (uint)((*(uint *)local_48 >> 0x1a & 4) != 0);
      JVar4 = JS_AtomGetKind((JSContext *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             in_stack_fffffffffffffef4);
      if ((((local_2c & 0x10) == 0) || (uVar7 != 0)) &&
         (((int)local_2c >> ((byte)JVar4 & 0x1f) & 1U) != 0)) {
        BVar6 = JS_AtomIsArrayIndex((JSContext *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    (uint32_t *)
                                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffeec);
        if (BVar6 == 0) {
          if (JVar4 == JS_ATOM_KIND_STRING) {
            local_34 = local_74;
            local_74 = local_74 + 1;
          }
          else {
            local_34 = local_78;
            local_78 = local_78 + 1;
          }
        }
        else {
          local_34 = local_70;
          bVar3 = false;
          local_70 = local_70 + 1;
        }
        JVar8 = JS_DupAtom((JSContext *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffeec);
        *(JSAtom *)((long)local_50 + (long)(int)local_34 * 8 + 4) = JVar8;
        *(uint *)((long)local_50 + (long)(int)local_34 * 8) = uVar7;
      }
    }
    local_48 = local_48 + 1;
  }
  if ((*(byte *)((long)local_28.ptr + 5) >> 2 & 1) == 0) goto LAB_0012a398;
  if ((*(byte *)((long)local_28.ptr + 5) >> 3 & 1) == 0) {
    if (*(short *)((long)local_28.ptr + 6) != 5) {
      for (local_30 = 0; local_30 < local_7c; local_30 = local_30 + 1) {
        local_5c = local_58[(int)local_30].atom;
        iVar5 = local_58[(int)local_30].is_enumerable;
        JVar4 = JS_AtomGetKind((JSContext *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               in_stack_fffffffffffffef4);
        if ((((local_2c & 0x10) == 0) || (iVar5 != 0)) &&
           (((int)local_2c >> ((byte)JVar4 & 0x1f) & 1U) != 0)) {
          *(JSAtom *)((long)local_50 + (ulong)local_78 * 8 + 4) = local_5c;
          *(int *)((long)local_50 + (ulong)local_78 * 8) = iVar5;
          local_78 = local_78 + 1;
        }
        else {
          JS_FreeAtom((JSContext *)in_stack_fffffffffffffee0.ptr,(JSAtom)((ulong)tab >> 0x20));
        }
      }
      js_free((JSContext *)in_stack_fffffffffffffee0.ptr,tab);
      goto LAB_0012a398;
    }
    if ((local_2c & 1) == 0) goto LAB_0012a398;
    obj.tag._0_4_ = 0xffffffff;
    obj.u.ptr = local_28.ptr;
    obj.tag._4_4_ = 0xffffffff;
    uVar9 = js_string_obj_get_length(local_10,obj);
    in_stack_fffffffffffffee0 = local_28;
  }
  else {
    if ((local_2c & 1) == 0) goto LAB_0012a398;
    uVar9 = *(uint32_t *)((long)local_28.ptr + 0x40);
  }
  for (local_30 = 0; (int)local_30 < (int)uVar9; local_30 = local_30 + 1) {
    JVar8 = __JS_AtomFromUInt32(local_30);
    *(JSAtom *)((long)local_50 + (ulong)local_70 * 8 + 4) = JVar8;
    if (*(int *)((long)local_50 + (ulong)local_70 * 8 + 4) == 0) {
      js_free_prop_enum((JSContext *)in_stack_fffffffffffffee0.ptr,(JSPropertyEnum *)tab,0);
      return -1;
    }
    *(undefined4 *)((long)local_50 + (ulong)local_70 * 8) = 1;
    local_70 = local_70 + 1;
  }
LAB_0012a398:
  if ((local_60 != 0) && (!bVar3)) {
    rqsort(in_stack_00000430,in_stack_00000428,in_stack_00000420,in_stack_00000418,in_stack_00000410
          );
  }
  *local_18 = local_50;
  *local_20 = local_6c;
  return 0;
}

Assistant:

static int __exception JS_GetOwnPropertyNamesInternal(JSContext *ctx,
                                                      JSPropertyEnum **ptab,
                                                      uint32_t *plen,
                                                      JSObject *p, int flags)
{
    int i, j;
    JSShape *sh;
    JSShapeProperty *prs;
    JSPropertyEnum *tab_atom, *tab_exotic;
    JSAtom atom;
    uint32_t num_keys_count, str_keys_count, sym_keys_count, atom_count;
    uint32_t num_index, str_index, sym_index, exotic_count, exotic_keys_count;
    BOOL is_enumerable, num_sorted;
    uint32_t num_key;
    JSAtomKindEnum kind;
    
    /* clear pointer for consistency in case of failure */
    *ptab = NULL;
    *plen = 0;

    /* compute the number of returned properties */
    num_keys_count = 0;
    str_keys_count = 0;
    sym_keys_count = 0;
    exotic_keys_count = 0;
    exotic_count = 0;
    tab_exotic = NULL;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                /* need to raise an exception in case of the module
                   name space (implicit GetOwnProperty) */
                if (unlikely((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) &&
                    (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY))) {
                    JSVarRef *var_ref = p->prop[i].u.var_ref;
                    if (unlikely(JS_IsUninitialized(*var_ref->pvalue))) {
                        JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                        return -1;
                    }
                }
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    num_keys_count++;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    str_keys_count++;
                } else {
                    sym_keys_count++;
                }
            }
        }
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += p->u.array.count;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->get_own_property_names) {
                if (em->get_own_property_names(ctx, &tab_exotic, &exotic_count,
                                               JS_MKPTR(JS_TAG_OBJECT, p)))
                    return -1;
                for(i = 0; i < exotic_count; i++) {
                    atom = tab_exotic[i].atom;
                    kind = JS_AtomGetKind(ctx, atom);
                    if (((flags >> kind) & 1) != 0) {
                        is_enumerable = FALSE;
                        if (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY)) {
                            JSPropertyDescriptor desc;
                            int res;
                            /* set the "is_enumerable" field if necessary */
                            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
                            if (res < 0) {
                                js_free_prop_enum(ctx, tab_exotic, exotic_count);
                                return -1;
                            }
                            if (res) {
                                is_enumerable =
                                    ((desc.flags & JS_PROP_ENUMERABLE) != 0);
                                js_free_desc(ctx, &desc);
                            }
                            tab_exotic[i].is_enumerable = is_enumerable;
                        }
                        if (!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) {
                            exotic_keys_count++;
                        }
                    }
                }
            }
        }
    }

    /* fill them */

    atom_count = num_keys_count + str_keys_count + sym_keys_count + exotic_keys_count;
    /* avoid allocating 0 bytes */
    tab_atom = js_malloc(ctx, sizeof(tab_atom[0]) * max_int(atom_count, 1));
    if (!tab_atom) {
        js_free_prop_enum(ctx, tab_exotic, exotic_count);
        return -1;
    }

    num_index = 0;
    str_index = num_keys_count;
    sym_index = str_index + str_keys_count;

    num_sorted = TRUE;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    j = num_index++;
                    num_sorted = FALSE;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    j = str_index++;
                } else {
                    j = sym_index++;
                }
                tab_atom[j].atom = JS_DupAtom(ctx, atom);
                tab_atom[j].is_enumerable = is_enumerable;
            }
        }
    }

    if (p->is_exotic) {
        int len;
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                len = p->u.array.count;
                goto add_array_keys;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                len = js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            add_array_keys:
                for(i = 0; i < len; i++) {
                    tab_atom[num_index].atom = __JS_AtomFromUInt32(i);
                    if (tab_atom[num_index].atom == JS_ATOM_NULL) {
                        js_free_prop_enum(ctx, tab_atom, num_index);
                        return -1;
                    }
                    tab_atom[num_index].is_enumerable = TRUE;
                    num_index++;
                }
            }
        } else {
            /* Note: exotic keys are not reordered and comes after the object own properties. */
            for(i = 0; i < exotic_count; i++) {
                atom = tab_exotic[i].atom;
                is_enumerable = tab_exotic[i].is_enumerable;
                kind = JS_AtomGetKind(ctx, atom);
                if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                    ((flags >> kind) & 1) != 0) {
                    tab_atom[sym_index].atom = atom;
                    tab_atom[sym_index].is_enumerable = is_enumerable;
                    sym_index++;
                } else {
                    JS_FreeAtom(ctx, atom);
                }
            }
            js_free(ctx, tab_exotic);
        }
    }

    assert(num_index == num_keys_count);
    assert(str_index == num_keys_count + str_keys_count);
    assert(sym_index == atom_count);

    if (num_keys_count != 0 && !num_sorted) {
        rqsort(tab_atom, num_keys_count, sizeof(tab_atom[0]), num_keys_cmp,
               ctx);
    }
    *ptab = tab_atom;
    *plen = atom_count;
    return 0;
}